

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     ToProperty<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
               (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                *input,Property *output,string *err)

{
  char cVar1;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *this;
  _Base_ptr args;
  bool bVar2;
  optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_> pv;
  storage_union local_920;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_910;
  char local_8f8;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_8f0;
  string local_8d8;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  storage_union local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [1472];
  
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = 0;
  local_8b8[0x10] = '\0';
  local_8b8[0x24] = false;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  args = &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._32_4_ = Uniform;
  local_910.
  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)output;
  local_890._M_p = (pointer)&local_880;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left = args;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right = args;
  tinyusdz::value::
  TypeTraits<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
  type_name_abi_cxx11_();
  ::std::__cxx11::string::_M_assign((string *)&local_890);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.dynamic != &local_600) {
    operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
  }
  if (input->_blocked == true) {
    local_858 = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&input->_paths);
  }
  bVar2 = (input->_attrib).has_value_;
  if (bVar2 == true) {
    local_8f8 = bVar2;
    ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
              (&local_8f0,
               (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
               &(input->_attrib).contained);
    cVar1 = local_8f8;
    if (local_8f8 == '\x01') {
      local_910.
      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&linb::any::
                     vtable_for_type<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>()
                     ::table;
      this = (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
             operator_new(0x18);
      ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                (this,&local_8f0);
      local_600._M_allocated_capacity =
           (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_610.dynamic =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_600._M_local_buf[8] = '\0';
      local_5f0._0_8_ = (pointer)0x0;
      local_5f0[8] = 0;
      local_5f0._9_7_ = 0;
      local_5f0[0x10] = 0;
      local_5f0._17_8_ = 0;
      local_920.dynamic = this;
      linb::any::operator=((any *)&local_610,(any *)&local_920);
      Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_610);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_5f0);
      if ((undefined8 *)local_600._M_allocated_capacity != (undefined8 *)0x0) {
        (**(code **)(local_600._M_allocated_capacity + 0x20))(&local_610);
      }
      if (local_910.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(local_910.
                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m[1][0])(&local_920);
      }
    }
    else if (err != (string *)0x0) {
      local_920.dynamic = &local_910;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_920,"[InternalError] Invalid TypedAttribute<{}> value.","");
      tinyusdz::value::
      TypeTraits<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
      type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>
                ((string *)&local_610,(fmt *)&local_920,&local_8d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_610.dynamic);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.dynamic != &local_600) {
        operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
        operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
      }
      if ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
          local_920.dynamic != &local_910) {
        operator_delete(local_920.dynamic,
                        (ulong)((long)(local_910.
                                       super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m[0] + 1));
      }
    }
    if ((local_8f8 == '\x01') &&
       (local_8f0.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_8f0.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8f0.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8f0.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (cVar1 == '\0') {
      bVar2 = false;
      goto LAB_004df0cc;
    }
  }
  AttrMetas::operator=(&AStack_818,&input->_metas);
  Property::Property((Property *)&local_610,(Attribute *)local_8b8,false);
  Property::operator=((Property *)
                      local_910.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Property *)&local_610);
  Property::~Property((Property *)&local_610);
  bVar2 = true;
LAB_004df0cc:
  AttrMetas::~AttrMetas(&AStack_818);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_850);
  if (local_860 != (vtable_type *)0x0) {
    (*local_860->destroy)(&local_870);
    local_860 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_p != &local_880) {
    operator_delete(local_890._M_p,
                    CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
    operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
  }
  return bVar2;
}

Assistant:

bool ToProperty(const TypedAttribute<T> &input, Property &output, std::string *err) {

#if 0 // old-code: TODO: Remove
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    output = Property::MakeEmptyAttrib(value::TypeTraits<T>::type_name(),
                                       /* custom */ false);
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship relTarget;
    std::vector<Path> paths = input.get_connections();
    if (paths.empty()) {
      if (err) {
        (*err) += fmt::format(
            "[InternalError] Connection attribute but empty targetPaths.");
      }
      return false;
    } else if (paths.size() == 1) {
      output = Property(paths[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      output = Property(paths, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    }

  } else {
    // Includes !authored()
    if (auto pv = input.get_value()) {
      value::Value val(pv.value());
      primvar::PrimVar pvar;
      pvar.set_value(val);
      Attribute attr;
      attr.set_var(std::move(pvar));
      attr.variability() = Variability::Uniform;
      output = Property(attr, /* custom */ false);
    } else {
      if (err) {
        (*err) +=
            fmt::format("[InternalError] Invalid TypedAttribute<{}> value.",
                        value::TypeTraits<T>::type_name());
      }

      return false;
    }
  }
#else

  Attribute attr;
  attr.variability() = Variability::Uniform;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  if (input.has_value()) {
    // Includes !authored()
    if (auto pv = input.get_value()) {
      value::Value val(pv.value());
      primvar::PrimVar pvar;
      pvar.set_value(val);

      attr.set_var(std::move(pvar));
    } else {
      if (err) {
        (*err) += fmt::format("[InternalError] Invalid TypedAttribute<{}> value.", value::TypeTraits<T>::type_name());
      }

      return false;
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */false);

#endif

  return true;
}